

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

size_t __thiscall websocketpp::http::parser::parser::process_body(parser *this,char *buf,size_t len)

{
  unsigned_long *puVar1;
  exception *peVar2;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a1;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  unsigned_long local_28;
  size_t processed;
  size_t len_local;
  char *buf_local;
  parser *this_local;
  
  processed = len;
  len_local = (size_t)buf;
  buf_local = (char *)this;
  if (this->m_body_encoding == plain) {
    puVar1 = std::min<unsigned_long>(&this->m_body_bytes_needed,&processed);
    local_28 = *puVar1;
    std::__cxx11::string::append((char *)&this->m_body,len_local);
    this->m_body_bytes_needed = this->m_body_bytes_needed - local_28;
    return local_28;
  }
  if (this->m_body_encoding == chunked) {
    local_a1 = 1;
    peVar2 = (exception *)__cxa_allocate_exception(0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unexpected body encoding",&local_49);
    std::__cxx11::string::string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_a0);
    exception::exception(peVar2,&local_48,internal_server_error,&local_80,&local_a0);
    local_a1 = 0;
    __cxa_throw(peVar2,&exception::typeinfo,exception::~exception);
  }
  peVar2 = (exception *)__cxa_allocate_exception(0x70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Unexpected body encoding",&local_c9);
  std::__cxx11::string::string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110);
  exception::exception(peVar2,&local_c8,internal_server_error,&local_f0,&local_110);
  __cxa_throw(peVar2,&exception::typeinfo,exception::~exception);
}

Assistant:

inline size_t parser::process_body(char const * buf, size_t len) {
    if (m_body_encoding == body_encoding::plain) {
        size_t processed = (std::min)(m_body_bytes_needed,len);
        m_body.append(buf,processed);
        m_body_bytes_needed -= processed;
        return processed;
    } else if (m_body_encoding == body_encoding::chunked) {
        // TODO: 
        throw exception("Unexpected body encoding",
            status_code::internal_server_error);
    } else {
        throw exception("Unexpected body encoding",
            status_code::internal_server_error);
    }
}